

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O0

void __thiscall MutableS2ShapeIndex::Iterator::Seek(Iterator *this,S2CellId target)

{
  const_iterator cVar1;
  Iterator *this_local;
  S2CellId target_local;
  
  this_local = (Iterator *)target.id_;
  cVar1 = gtl::internal_btree::
          btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
          ::lower_bound<S2CellId>
                    ((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                      *)&this->index_->cell_map_,(S2CellId *)&this_local);
  (this->iter_).node = cVar1.node;
  (this->iter_).position = cVar1.position;
  Refresh(this);
  return;
}

Assistant:

inline void MutableS2ShapeIndex::Iterator::Seek(S2CellId target) {
  iter_ = index_->cell_map_.lower_bound(target);
  Refresh();
}